

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall pugi::xml_node::remove_attribute(xml_node *this,xml_attribute *a)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct *pxVar4;
  bool bVar5;
  xml_allocator *alloc;
  xml_attribute_struct **ppxVar6;
  xml_attribute_struct *pxVar7;
  
  pxVar1 = this->_root;
  if (((pxVar1 != (xml_node_struct *)0x0) && (a->_attr != (xml_attribute_struct *)0x0)) &&
     (bVar5 = impl::anon_unknown_0::is_attribute_of(a->_attr,pxVar1), bVar5)) {
    alloc = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(pxVar1);
    pxVar2 = a->_attr;
    pxVar1 = this->_root;
    pxVar3 = pxVar2->next_attribute;
    pxVar4 = pxVar2->prev_attribute_c;
    pxVar7 = pxVar3;
    if (pxVar3 == (xml_attribute_struct *)0x0) {
      pxVar7 = pxVar1->first_attribute;
    }
    pxVar7->prev_attribute_c = pxVar4;
    ppxVar6 = &pxVar1->first_attribute;
    if (pxVar4->next_attribute != (xml_attribute_struct *)0x0) {
      ppxVar6 = &pxVar4->next_attribute;
    }
    *ppxVar6 = pxVar3;
    pxVar2->prev_attribute_c = (xml_attribute_struct *)0x0;
    pxVar2->next_attribute = (xml_attribute_struct *)0x0;
    impl::anon_unknown_0::destroy_attribute(a->_attr,alloc);
    return true;
  }
  return false;
}

Assistant:

PUGI__FN bool xml_node::remove_attribute(const xml_attribute& a)
	{
		if (!_root || !a._attr) return false;
		if (!impl::is_attribute_of(a._attr, _root)) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		impl::remove_attribute(a._attr, _root);
		impl::destroy_attribute(a._attr, alloc);

		return true;
	}